

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

void __thiscall wallet::SQLiteDatabase::Cleanup(SQLiteDatabase *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char *local_28;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_WalletDatabase)._vptr_WalletDatabase[8])();
  criticalblock1.super_unique_lock._M_device = (mutex_type *)g_sqlite_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock1.super_unique_lock);
  g_sqlite_count = g_sqlite_count + -1;
  if (g_sqlite_count == 0) {
    iVar2 = sqlite3_shutdown();
    if (iVar2 != 0) {
      local_28 = (char *)sqlite3_errstr(iVar2);
      logging_function._M_str = "Cleanup";
      logging_function._M_len = 7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file._M_len = 0x61;
      LogPrintFormatInternal<char_const*>
                (logging_function,source_file,0xb9,ALL,Info,(ConstevalFormatString<1U>)0x8343ee,
                 &local_28);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SQLiteDatabase::Cleanup() noexcept
{
    AssertLockNotHeld(g_sqlite_mutex);

    Close();

    LOCK(g_sqlite_mutex);
    if (--g_sqlite_count == 0) {
        int ret = sqlite3_shutdown();
        if (ret != SQLITE_OK) {
            LogPrintf("SQLiteDatabase: Failed to shutdown SQLite: %s\n", sqlite3_errstr(ret));
        }
    }
}